

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O1

void wasm::UniqueNameMapper::uniquify(wasm::Expression*)::Walker::
     doPostVisitControlFlow(Walker*,wasm::Expression___(Walker *self,Expression **currp)

{
  Id IVar1;
  Expression *pEVar2;
  char *pcVar3;
  Name name;
  
  pEVar2 = *currp;
  IVar1 = pEVar2->_id;
  if ((int)IVar1 < 3) {
    if (IVar1 != BlockId) {
      if (IVar1 != InvalidId) {
        return;
      }
      goto LAB_0095cc60;
    }
  }
  else if ((IVar1 != LoopId) && (IVar1 != TryId)) {
    if (IVar1 != NumExpressionIds) {
      return;
    }
LAB_0095cc60:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  }
  pcVar3 = (char *)pEVar2[1].type.id;
  if (pcVar3 == (char *)0x0) {
    return;
  }
  name.super_IString.str._M_str = pcVar3;
  name.super_IString.str._M_len = *(size_t *)(pEVar2 + 1);
  popLabelName(&self->mapper,name);
  return;
}

Assistant:

static void doPostVisitControlFlow(Walker* self, Expression** currp) {
      BranchUtils::operateOnScopeNameDefs(*currp, [&](Name& name) {
        if (name.is()) {
          self->mapper.popLabelName(name);
        }
      });
    }